

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O2

void __thiscall wasm::InstrumentMemory::visitStore(InstrumentMemory *this,Store *curr)

{
  Type indexType;
  char *pcVar1;
  size_t sVar2;
  Name target;
  BasicType BVar3;
  uint uVar4;
  Memory *pMVar5;
  Const *pCVar6;
  Call *pCVar7;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_90;
  Expression *local_78;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_70;
  size_t local_58;
  char *local_50;
  InstrumentMemory *local_48;
  Builder local_40;
  Builder builder;
  
  this->id = this->id + 1;
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  pMVar5 = Module::getMemory(local_40.wasm,(Name)(curr->memory).super_IString.str);
  indexType.id = (pMVar5->indexType).id;
  pCVar6 = Builder::makeConstPtr(&local_40,(curr->offset).addr,indexType);
  local_58 = store_ptr;
  local_50 = DAT_00e637b0;
  local_48 = this;
  local_90._M_impl.super__Vector_impl_data._M_start =
       (pointer)Builder::makeConst<int>(&local_40,this->id);
  local_90._M_impl.super__Vector_impl_data._M_finish =
       (pointer)Builder::makeConst<int>(&local_40,(uint)curr->bytes);
  local_78 = curr->ptr;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_90;
  local_90._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar6;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_70,__l,
             (allocator_type *)((long)&builder.wasm + 7));
  target.super_IString.str._M_str = local_50;
  target.super_IString.str._M_len = local_58;
  pCVar7 = Builder::makeCall(&local_40,target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_70,indexType,false);
  curr->ptr = (Expression *)pCVar7;
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_70);
  BVar3 = wasm::Type::getBasic(&curr->value->type);
  uVar4 = BVar3 - i32;
  if (uVar4 < 4) {
    pcVar1 = *(char **)(&PTR_DAT_00e1f020)[uVar4];
    sVar2 = *(size_t *)(&PTR_store_val_i32_00e1f000)[uVar4];
    local_70._M_impl.super__Vector_impl_data._M_start =
         (pointer)Builder::makeConst<int>(&local_40,local_48->id);
    local_70._M_impl.super__Vector_impl_data._M_finish = (pointer)curr->value;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_70;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_90,__l_00,
               (allocator_type *)((long)&builder.wasm + 7));
    target_00.super_IString.str._M_str = pcVar1;
    target_00.super_IString.str._M_len = sVar2;
    pCVar7 = Builder::makeCall(&local_40,target_00,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_90,(Type)(curr->value->type).id,false);
    curr->value = (Expression *)pCVar7;
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_90);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    id++;
    Builder builder(*getModule());
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto offset = builder.makeConstPtr(curr->offset.addr, indexType);
    curr->ptr = builder.makeCall(store_ptr,
                                 {builder.makeConst(int32_t(id)),
                                  builder.makeConst(int32_t(curr->bytes)),
                                  offset,
                                  curr->ptr},
                                 indexType);
    Name target;
    switch (curr->value->type.getBasic()) {
      case Type::i32:
        target = store_val_i32;
        break;
      case Type::i64:
        target = store_val_i64;
        break;
      case Type::f32:
        target = store_val_f32;
        break;
      case Type::f64:
        target = store_val_f64;
        break;
      default:
        return; // TODO: other types, unreachable, etc.
    }
    curr->value = builder.makeCall(
      target, {builder.makeConst(int32_t(id)), curr->value}, curr->value->type);
  }